

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

CheckerDataDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::CheckerDataDeclarationSyntax,slang::syntax::CheckerDataDeclarationSyntax_const&>
          (BumpAllocator *this,CheckerDataDeclarationSyntax *args)

{
  CheckerDataDeclarationSyntax *pCVar1;
  CheckerDataDeclarationSyntax *in_RSI;
  size_t in_RDI;
  size_t unaff_retaddr;
  
  pCVar1 = (CheckerDataDeclarationSyntax *)allocate((BumpAllocator *)args,unaff_retaddr,in_RDI);
  slang::syntax::CheckerDataDeclarationSyntax::CheckerDataDeclarationSyntax(in_RSI,pCVar1);
  return pCVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }